

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O3

int ffghsp(fitsfile *fptr,int *nexist,int *nmore,int *status)

{
  undefined1 auVar1 [16];
  int iVar2;
  FITSfile *pFVar3;
  
  if (0 < *status) {
    return *status;
  }
  pFVar3 = fptr->Fptr;
  if (fptr->HDUposition != pFVar3->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    pFVar3 = fptr->Fptr;
  }
  if (nexist != (int *)0x0) {
    auVar1 = SEXT816(pFVar3->headend - pFVar3->headstart[pFVar3->curhdu]) *
             SEXT816(0x6666666666666667);
    *nexist = (int)(auVar1._8_8_ >> 5) - (auVar1._12_4_ >> 0x1f);
  }
  if (pFVar3->datastart == -1) {
    iVar2 = -1;
    if (nmore == (int *)0x0) goto LAB_001b0c0b;
  }
  else {
    if (nmore == (int *)0x0) goto LAB_001b0c0b;
    auVar1 = SEXT816(pFVar3->datastart - pFVar3->headend) * SEXT816(0x6666666666666667);
    iVar2 = ((int)(auVar1._8_8_ >> 5) - (auVar1._12_4_ >> 0x1f)) + -1;
  }
  *nmore = iVar2;
LAB_001b0c0b:
  return *status;
}

Assistant:

int ffghsp(fitsfile *fptr,  /* I - FITS file pointer                     */
           int *nexist,     /* O - number of existing keywords in header */
           int *nmore,      /* O - how many more keywords will fit       */
           int *status)     /* IO - error status                         */
/*
  returns the number of existing keywords (not counting the END keyword)
  and the number of more keyword that will fit in the current header 
  without having to insert more FITS blocks.
*/
{
    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (nexist)
        *nexist = (int) (( ((fptr->Fptr)->headend) - 
                ((fptr->Fptr)->headstart[(fptr->Fptr)->curhdu]) ) / 80);

    if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
    {
      if (nmore)
        *nmore = -1;   /* data not written yet, so room for any keywords */
    }
    else
    {
      /* calculate space available between the data and the END card */
      if (nmore)
        *nmore = (int) (((fptr->Fptr)->datastart - (fptr->Fptr)->headend) / 80 - 1);
    }

    return(*status);
}